

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VCFrontEnd.h
# Opt level: O0

double __thiscall VCTools::InputParser::getFloatArg(InputParser *this,string *arg,double def)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char *__nptr;
  string *in_RDI;
  double in_XMM0_Qa;
  string nr;
  bool local_69;
  string local_40 [32];
  double local_20;
  InputParser *in_stack_fffffffffffffff8;
  
  local_20 = in_XMM0_Qa;
  getCmdOption(in_stack_fffffffffffffff8,in_RDI);
  lVar1 = std::__cxx11::string::size();
  local_69 = false;
  if (lVar1 != 0) {
    uVar2 = std::__cxx11::string::begin();
    uVar3 = std::__cxx11::string::end();
    local_69 = std::
               all_of<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,VCTools::InputParser::getFloatArg(std::__cxx11::string_const&,double)::_lambda(unsigned_char)_1_>
                         (uVar2,uVar3);
  }
  if (local_69 != false) {
    __nptr = (char *)std::__cxx11::string::c_str();
    local_20 = atof(__nptr);
  }
  std::__cxx11::string::~string(local_40);
  return local_20;
}

Assistant:

double getFloatArg(const string& arg, double def = -1) {
			string nr = getCmdOption(arg);
			if (nr.size() > 0 && std::all_of(nr.begin(), nr.end(), 
				[](unsigned char c) {return ::isdigit(c) || c == '.'; }))
				return atof(nr.c_str());
			return def;
		}